

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::build_accel(PathTracer *this)

{
  pointer ppSVar1;
  rep rVar2;
  long lVar3;
  BVHAccel *this_00;
  pointer ppSVar4;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  primitives;
  _Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  local_48;
  
  fwrite("[PathTracer] Collecting primitives... ",0x26,1,_stdout);
  fflush(_stdout);
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->timer).t0.__d.__r = rVar2;
  primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar1 = (this->scene->objects).
            super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar4 = (this->scene->objects).
                 super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1;
      ppSVar4 = ppSVar4 + 1) {
    (**(*ppSVar4)->_vptr_SceneObject)(&local_48);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::reserve(&primitives,
              ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3) +
              ((long)primitives.
                     super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)primitives.
                     super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>::
    insert<__gnu_cxx::__normal_iterator<CMU462::StaticScene::Primitive*const*,std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>>,void>
              ((vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>
                *)&primitives,
               (const_iterator)
               primitives.
               super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<CMU462::StaticScene::Primitive_*const_*,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
                )local_48._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<CMU462::StaticScene::Primitive_*const_*,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
                )local_48._M_impl.super__Vector_impl_data._M_finish);
    std::
    _Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::~_Vector_base(&local_48);
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  (this->timer).t1.__d.__r = lVar3;
  fprintf(_stdout,"Done! (%.4f sec)\n",(double)(lVar3 - (this->timer).t0.__d.__r) / 1000000000.0);
  fwrite("[PathTracer] Building BVH... ",0x1d,1,_stdout);
  fflush(_stdout);
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->timer).t0.__d.__r = rVar2;
  this_00 = (BVHAccel *)operator_new(0x28);
  StaticScene::BVHAccel::BVHAccel(this_00,&primitives,4);
  this->bvh = this_00;
  lVar3 = std::chrono::_V2::steady_clock::now();
  (this->timer).t1.__d.__r = lVar3;
  fprintf(_stdout,"Done! (%.4f sec)\n",(double)(lVar3 - (this->timer).t0.__d.__r) / 1000000000.0);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)this->bvh->root;
  std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>::
  emplace_back<CMU462::StaticScene::BVHNode*>
            ((deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>> *)
             &this->selectionHistory,(BVHNode **)&local_48);
  std::
  _Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ::~_Vector_base(&primitives.
                   super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                 );
  return;
}

Assistant:

void PathTracer::build_accel() {
  // collect primitives //
  fprintf(stdout, "[PathTracer] Collecting primitives... ");
  fflush(stdout);
  timer.start();
  vector<Primitive *> primitives;
  for (SceneObject *obj : scene->objects) {
    const vector<Primitive *> &obj_prims = obj->get_primitives();
    primitives.reserve(primitives.size() + obj_prims.size());
    primitives.insert(primitives.end(), obj_prims.begin(), obj_prims.end());
  }
  timer.stop();
  fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

  // build BVH //
  fprintf(stdout, "[PathTracer] Building BVH... ");
  fflush(stdout);
  timer.start();
  bvh = new BVHAccel(primitives);
  timer.stop();
  fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

  // initial visualization //
  selectionHistory.push(bvh->get_root());
}